

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsHash.h
# Opt level: O2

bool __thiscall
HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>::
insert<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>>
          (HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>
           *this,HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
                 *args)

{
  byte bVar1;
  u8 uVar2;
  int iVar3;
  long lVar4;
  pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> pVar5;
  bool bVar6;
  long lVar7;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  u8 meta;
  u64 pos;
  u64 maxPos;
  u64 startPos;
  u8 local_31;
  HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
  local_30;
  ulong local_20;
  ulong local_18;
  ulong local_10;
  
  local_30.value_ = args->value_;
  local_30.key_ = args->key_;
  bVar6 = HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::
          findPosition((HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
                        *)this,&local_30.key_,&local_31,&local_10,&local_18,&local_20);
  if (bVar6) {
    bVar6 = false;
  }
  else {
    uVar8 = *(ulong *)(this + 0x10);
    if ((*(ulong *)(this + 0x20) != uVar8 * 7 + 7 >> 3) && (local_20 != local_18)) {
      lVar4 = *(long *)this;
      *(ulong *)(this + 0x20) = *(ulong *)(this + 0x20) + 1;
      uVar9 = local_18;
      do {
        pVar5 = local_30.key_;
        bVar1 = *(byte *)(*(long *)(this + 8) + local_20);
        if (-1 < (char)bVar1) {
          *(u8 *)(*(long *)(this + 8) + local_20) = local_31;
          *(int *)(lVar4 + 8 + local_20 * 0xc) = local_30.value_;
          *(pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> *)
           (lVar4 + local_20 * 0xc) = local_30.key_;
          return true;
        }
        uVar10 = (ulong)((int)local_20 - (uint)bVar1 & 0x7f);
        if (uVar10 < (local_20 - local_10 & uVar8)) {
          lVar7 = local_20 * 0xc;
          local_30.key_.second = *(CliqueVar *)(lVar4 + 4 + lVar7);
          local_30.key_.first = *(CliqueVar *)(lVar4 + lVar7);
          iVar3 = *(int *)(lVar4 + 8 + lVar7);
          *(pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar> *)(lVar4 + lVar7) = pVar5
          ;
          *(int *)(lVar4 + 8 + lVar7) = local_30.value_;
          uVar2 = *(u8 *)(*(long *)(this + 8) + local_20);
          *(u8 *)(*(long *)(this + 8) + local_20) = local_31;
          uVar8 = *(ulong *)(this + 0x10);
          local_10 = local_20 - uVar10 & uVar8;
          uVar9 = local_10 + 0x7f & uVar8;
          local_31 = uVar2;
          local_30.value_ = iVar3;
          local_18 = uVar9;
        }
        local_20 = local_20 + 1 & uVar8;
      } while (local_20 != uVar9);
      HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::
      growTable((HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
                 *)this);
      insert<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>>
                (this,&local_30);
      return true;
    }
    HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>::
    growTable((HighsHashTable<std::pair<HighsCliqueTable::CliqueVar,_HighsCliqueTable::CliqueVar>,_int>
               *)this);
    bVar6 = insert<HighsHashTableEntry<std::pair<HighsCliqueTable::CliqueVar,HighsCliqueTable::CliqueVar>,int>>
                      (this,&local_30);
  }
  return bVar6;
}

Assistant:

bool insert(Args&&... args) {
    Entry entry(std::forward<Args>(args)...);

    u64 pos, startPos, maxPos;
    u8 meta;
    if (findPosition(entry.key(), meta, startPos, maxPos, pos)) return false;

    if (numElements == ((tableSizeMask + 1) * 7) / 8 || pos == maxPos) {
      growTable();
      return insert(std::move(entry));
    }

    using std::swap;
    Entry* entryArray = entries.get();
    ++numElements;

    do {
      if (!occupied(metadata[pos])) {
        metadata[pos] = meta;
        new (&entryArray[pos]) Entry{std::move(entry)};
        return true;
      }

      u64 currentDistance = (pos - startPos) & tableSizeMask;
      u64 distanceOfCurrentOccupant = distanceFromIdealSlot(pos);
      if (currentDistance > distanceOfCurrentOccupant) {
        // steal the position
        swap(entry, entryArray[pos]);
        swap(meta, metadata[pos]);

        startPos = (pos - distanceOfCurrentOccupant) & tableSizeMask;
        maxPos = (startPos + maxDistance()) & tableSizeMask;
      }
      pos = (pos + 1) & tableSizeMask;
    } while (pos != maxPos);

    growTable();
    insert(std::move(entry));
    return true;
  }